

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O0

ares_status_t
process_config_lines
          (ares_channel_t *channel,char *filename,ares_sysconfig_t *sysconfig,
          ares_sysconfig_line_cb_t cb)

{
  ares_buf_t *buf_00;
  ares_buf_t *buf;
  ares_status_t status;
  ares_sysconfig_line_cb_t cb_local;
  ares_sysconfig_t *sysconfig_local;
  char *filename_local;
  ares_channel_t *channel_local;
  
  buf_00 = ares_buf_create();
  if (buf_00 == (ares_buf_t *)0x0) {
    buf._4_4_ = ARES_ENOMEM;
  }
  else {
    buf._4_4_ = ares_buf_load_file(filename,buf_00);
    if (buf._4_4_ == ARES_SUCCESS) {
      buf._4_4_ = ares_sysconfig_process_buf(channel,sysconfig,buf_00,cb);
    }
  }
  ares_buf_destroy(buf_00);
  return buf._4_4_;
}

Assistant:

static ares_status_t process_config_lines(const ares_channel_t    *channel,
                                          const char              *filename,
                                          ares_sysconfig_t        *sysconfig,
                                          ares_sysconfig_line_cb_t cb)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;

  buf = ares_buf_create();
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_load_file(filename, buf);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  status = ares_sysconfig_process_buf(channel, sysconfig, buf, cb);

done:
  ares_buf_destroy(buf);

  return status;
}